

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_typed_tests.hpp
# Opt level: O0

void __thiscall
iutest::detail::
TypeParamTestInstance<syntax_tests::iu_TypedPrintToTest_x_iutest_x_Print_Test,_iutest::detail::VariadicTypeList<char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_int_*>_>
::EachTest<iutest::detail::VariadicTypeList<long,_unsigned_long,_int_*>,_void>::AddTest
          (EachTest<iutest::detail::VariadicTypeList<long,_unsigned_long,_int_*>,_void> *this)

{
  UnitTest *this_00;
  TestSuite *pCase;
  EachTest<iutest::detail::VariadicTypeList<long,_unsigned_long,_int_*>,_void> *this_local;
  
  this_00 = UnitTest::instance();
  pCase = iuITestSuiteMediator::ptr((iuITestSuiteMediator *)this);
  UnitTestImpl::AddTestInfo(&this_00->super_UnitTestImpl,pCase,&this->m_info);
  EachTest<iutest::detail::VariadicTypeList<unsigned_long,_int_*>,_void>::AddTest(&this->m_next);
  return;
}

Assistant:

void AddTest()
        {
            // 順番通りになるように前から登録
            UnitTest::instance().AddTestInfo(m_mediator.ptr(), &m_info);
            m_next.AddTest();
        }